

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O1

int testSamePaddingConvolution(void)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_ShapeRange *pAVar8;
  Type *pTVar9;
  TypeUnion this;
  Type *this_00;
  ConvolutionLayerParams *pCVar10;
  SamePadding *this_01;
  WeightParams *pWVar11;
  ShapeConstraint *pSVar12;
  ShapeRange *pSVar13;
  size_t sVar14;
  ostream *poVar15;
  int iVar16;
  int iVar17;
  RangeValue RVar18;
  Model m1;
  NeuralNetworkShaper shapes;
  string local_d8;
  Model local_b8;
  undefined1 local_88 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_50;
  
  CoreML::Specification::Model::Model(&local_b8);
  if (local_b8.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_b8.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b8.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 4;
  pTVar9->upperbound_ = 4;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 100;
  pTVar9->upperbound_ = 100;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(pAVar8);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     (&(((pAVar7->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                       super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->lowerbound_ = 100;
  pTVar9->upperbound_ = 200;
  if (local_b8.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_b8.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_b8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_b8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_b8);
    local_b8._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_b8.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_b8.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 100;
    pCVar10 = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(pCVar10);
    (this_00->layer_).convolution_ = pCVar10;
  }
  pCVar10 = (this_00->layer_).convolution_;
  pCVar10->outputchannels_ = 5;
  pCVar10->kernelchannels_ = 4;
  iVar17 = (pCVar10->kernelsize_).total_size_;
  if ((pCVar10->kernelsize_).current_size_ == iVar17) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar10->kernelsize_,iVar17 + 1);
  }
  iVar17 = (pCVar10->kernelsize_).current_size_;
  iVar16 = iVar17 + 1;
  (pCVar10->kernelsize_).current_size_ = iVar16;
  ((pCVar10->kernelsize_).rep_)->elements[iVar17] = 7;
  iVar17 = (pCVar10->kernelsize_).total_size_;
  if (iVar16 == iVar17) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar10->kernelsize_,iVar17 + 1);
  }
  iVar17 = (pCVar10->kernelsize_).current_size_;
  (pCVar10->kernelsize_).current_size_ = iVar17 + 1;
  ((pCVar10->kernelsize_).rep_)->elements[iVar17] = 8;
  if (pCVar10->_oneof_case_[0] != 0x33) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(pCVar10);
    pCVar10->_oneof_case_[0] = 0x33;
    this_01 = (SamePadding *)operator_new(0x18);
    CoreML::Specification::SamePadding::SamePadding(this_01);
    (pCVar10->ConvolutionPaddingType_).same_ = this_01;
  }
  pCVar10->hasbias_ = false;
  iVar17 = 0x460;
  do {
    if (pCVar10->weights_ == (WeightParams *)0x0) {
      pWVar11 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar11);
      pCVar10->weights_ = pWVar11;
    }
    pWVar11 = pCVar10->weights_;
    iVar16 = (pWVar11->floatvalue_).total_size_;
    if ((pWVar11->floatvalue_).current_size_ == iVar16) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar11->floatvalue_,iVar16 + 1);
    }
    iVar16 = (pWVar11->floatvalue_).current_size_;
    (pWVar11->floatvalue_).current_size_ = iVar16 + 1;
    ((pWVar11->floatvalue_).rep_)->elements[iVar16] = 1.0;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_88,&local_b8,true);
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"input","");
  pSVar12 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_88,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  pSVar13 = CoreML::ShapeConstraint::sequenceRange(pSVar12);
  sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
  if (sVar14 == 0) {
    pSVar13 = CoreML::ShapeConstraint::sequenceRange(pSVar12);
    RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
    local_d8._M_string_length = RVar18._val;
    local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
    bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
    if (bVar3) {
      pSVar13 = CoreML::ShapeConstraint::batchRange(pSVar12);
      sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
      if (sVar14 == 0) {
        pSVar13 = CoreML::ShapeConstraint::batchRange(pSVar12);
        RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
        local_d8._M_string_length = RVar18._val;
        local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
        bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
        if (bVar3) {
          pSVar13 = CoreML::ShapeConstraint::channelRange(pSVar12);
          sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
          if (sVar14 == 4) {
            pSVar13 = CoreML::ShapeConstraint::channelRange(pSVar12);
            RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
            local_d8._M_string_length = RVar18._val;
            local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
            sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
            if (sVar14 == 4) {
              pSVar13 = CoreML::ShapeConstraint::heightRange(pSVar12);
              sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
              if (sVar14 == 100) {
                pSVar13 = CoreML::ShapeConstraint::heightRange(pSVar12);
                RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                local_d8._M_string_length = RVar18._val;
                local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                if (sVar14 == 100) {
                  pSVar13 = CoreML::ShapeConstraint::widthRange(pSVar12);
                  sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                  if (sVar14 == 100) {
                    pSVar13 = CoreML::ShapeConstraint::widthRange(pSVar12);
                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                    local_d8._M_string_length = RVar18._val;
                    local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                    sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                    if (sVar14 == 200) {
                      local_d8._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_d8,"output","");
                      pSVar12 = CoreML::NeuralNetworkShaper::shape
                                          ((NeuralNetworkShaper *)local_88,&local_d8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != paVar2) {
                        operator_delete(local_d8._M_dataplus._M_p,
                                        local_d8.field_2._M_allocated_capacity + 1);
                      }
                      pSVar13 = CoreML::ShapeConstraint::sequenceRange(pSVar12);
                      sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                      if (sVar14 == 0) {
                        pSVar13 = CoreML::ShapeConstraint::sequenceRange(pSVar12);
                        RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                        local_d8._M_string_length = RVar18._val;
                        local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                        bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
                        if (bVar3) {
                          pSVar13 = CoreML::ShapeConstraint::batchRange(pSVar12);
                          sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                          if (sVar14 == 0) {
                            pSVar13 = CoreML::ShapeConstraint::batchRange(pSVar12);
                            RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                            local_d8._M_string_length = RVar18._val;
                            local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                            bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d8);
                            if (bVar3) {
                              pSVar13 = CoreML::ShapeConstraint::channelRange(pSVar12);
                              sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                              if (sVar14 == 5) {
                                pSVar13 = CoreML::ShapeConstraint::channelRange(pSVar12);
                                RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                                local_d8._M_string_length = RVar18._val;
                                local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                                if (sVar14 == 5) {
                                  pSVar13 = CoreML::ShapeConstraint::heightRange(pSVar12);
                                  sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                                  if (sVar14 == 100) {
                                    pSVar13 = CoreML::ShapeConstraint::heightRange(pSVar12);
                                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                                    local_d8._M_string_length = RVar18._val;
                                    local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                    sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                                    if (sVar14 == 100) {
                                      pSVar13 = CoreML::ShapeConstraint::widthRange(pSVar12);
                                      sVar14 = CoreML::ShapeRange::minimumValue(pSVar13);
                                      if (sVar14 == 100) {
                                        pSVar13 = CoreML::ShapeConstraint::widthRange(pSVar12);
                                        RVar18 = CoreML::ShapeRange::maximumValue(pSVar13);
                                        local_d8._M_string_length = RVar18._val;
                                        local_d8._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                        sVar14 = CoreML::RangeValue::value((RangeValue *)&local_d8);
                                        iVar17 = 0;
                                        if (sVar14 == 200) goto LAB_001676ad;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  ,0x6c);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        poVar15 = (ostream *)
                                                  std::ostream::operator<<
                                                            ((ostream *)&std::cout,0x198);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15,": error: ",9);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15,
                                                  "outShape.widthRange().maximumValue().value() == 200"
                                                  ,0x33);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," was false, expected true.",0x1a);
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  ,0x6c);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        poVar15 = (ostream *)
                                                  std::ostream::operator<<
                                                            ((ostream *)&std::cout,0x197);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15,": error: ",9);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15,
                                                  "outShape.widthRange().minimumValue() == 100",0x2b
                                                  );
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," was false, expected true.",0x1a);
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                 ,0x6c);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,":",1);
                                      poVar15 = (ostream *)
                                                std::ostream::operator<<
                                                          ((ostream *)&std::cout,0x195);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar15,": error: ",9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar15,
                                                 "outShape.heightRange().maximumValue().value() == 100"
                                                 ,0x34);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar15," was false, expected true.",0x1a);
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                               ,0x6c);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,":",1);
                                    poVar15 = (ostream *)
                                              std::ostream::operator<<((ostream *)&std::cout,0x194);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar15,": error: ",9);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar15,
                                               "outShape.heightRange().minimumValue() == 100",0x2c);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar15," was false, expected true.",0x1a);
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             ,0x6c);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,":",1);
                                  poVar15 = (ostream *)
                                            std::ostream::operator<<((ostream *)&std::cout,0x192);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,": error: ",9);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,
                                             "outShape.channelRange().maximumValue().value() == 5",
                                             0x33);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15," was false, expected true.",0x1a);
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           ,0x6c);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,":",1);
                                poVar15 = (ostream *)
                                          std::ostream::operator<<((ostream *)&std::cout,0x191);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar15,": error: ",9);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar15,"outShape.channelRange().minimumValue() == 5",
                                           0x2b);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar15," was false, expected true.",0x1a);
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         ,0x6c);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,":",1);
                              poVar15 = (ostream *)
                                        std::ostream::operator<<((ostream *)&std::cout,399);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,": error: ",9);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,"outShape.batchRange().maximumValue().isUnbound()",
                                         0x30);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15," was false, expected true.",0x1a);
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       ,0x6c);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,":",1);
                            poVar15 = (ostream *)
                                      std::ostream::operator<<((ostream *)&std::cout,0x18e);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,": error: ",9);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,"outShape.batchRange().minimumValue() == 0",0x29);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15," was false, expected true.",0x1a);
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     ,0x6c);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18c)
                          ;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,"outShape.sequenceRange().maximumValue().isUnbound()",
                                     0x33);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15," was false, expected true.",0x1a);
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   ,0x6c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,"outShape.sequenceRange().minimumValue() == 0",0x2c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15," was false, expected true.",0x1a);
                      }
                      iVar17 = 1;
                      std::endl<char,std::char_traits<char>>(poVar15);
                      goto LAB_001676ad;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x6c);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x188);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,"inShape.widthRange().maximumValue().value() == 200",0x32);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," was false, expected true.",0x1a);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x6c);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x187);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,"inShape.widthRange().minimumValue() == 100",0x2a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," was false, expected true.",0x1a);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             ,0x6c);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x185);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"inShape.heightRange().maximumValue().value() == 100",0x33);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15," was false, expected true.",0x1a);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x184);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,"inShape.heightRange().minimumValue() == 100",0x2b);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15," was false, expected true.",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x182);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"inShape.channelRange().maximumValue().value() == 4",0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," was false, expected true.",0x1a);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x181);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"inShape.channelRange().minimumValue() == 4",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," was false, expected true.",0x1a);
          }
          iVar17 = 1;
          std::endl<char,std::char_traits<char>>(poVar15);
          goto LAB_001676ad;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"inShape.batchRange().maximumValue().isUnbound()",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"inShape.batchRange().minimumValue() == 0",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"inShape.sequenceRange().maximumValue().isUnbound()",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"inShape.sequenceRange().minimumValue() == 0",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  std::ostream::put((char)poVar15);
  iVar17 = 1;
  std::ostream::flush();
LAB_001676ad:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_88 + 8));
  CoreML::Specification::Model::~Model(&local_b8);
  return iVar17;
}

Assistant:

int testSamePaddingConvolution() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(100);
    shape2->set_upperbound(100);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(100);
    shape3->set_upperbound(200);
    
    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("output");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(7);
    convParams->add_kernelsize(8);
    convParams->mutable_same();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*7*8; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 100);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(inShape.widthRange().minimumValue() == 100);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 200);
    
    const ShapeConstraint &outShape = shapes.shape("output");
    ML_ASSERT(outShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(outShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.batchRange().minimumValue() == 0);
    ML_ASSERT(outShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.channelRange().minimumValue() == 5);
    ML_ASSERT(outShape.channelRange().maximumValue().value() == 5);
    
    ML_ASSERT(outShape.heightRange().minimumValue() == 100);
    ML_ASSERT(outShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(outShape.widthRange().minimumValue() == 100);
    ML_ASSERT(outShape.widthRange().maximumValue().value() == 200);


    return 0;
    
}